

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O1

bool xercesc_4_0::XMLUri::isWellFormedIPv6Reference(XMLCh *addr,XMLSize_t length)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong end;
  ulong uVar5;
  int counter;
  int local_24;
  
  if (((2 < length) && (*addr == L'[')) && (addr[length - 1] == L']')) {
    end = length - 1;
    local_24 = 0;
    iVar2 = scanHexSequence(addr,1,end,&local_24);
    if (iVar2 != -1) {
      uVar5 = (ulong)iVar2;
      if (end == uVar5) {
        return local_24 == 8;
      }
      if ((uVar5 + 1 < end) && (addr[uVar5] == L':')) {
        if (addr[uVar5 + 1] == L':') {
          iVar2 = local_24 + 1;
          if (local_24 < 8) {
            if (uVar5 + 2 == end) {
              return true;
            }
            local_24 = iVar2;
            iVar3 = scanHexSequence(addr,uVar5 + 2,end,&local_24);
            if (iVar3 != -1) {
              if (end == (long)iVar3) {
                return true;
              }
              lVar4 = (ulong)(iVar2 < local_24) + (long)iVar3;
              uVar5 = -lVar4;
              goto LAB_0025cad2;
            }
          }
        }
        else if (local_24 == 6) {
          lVar4 = uVar5 + 1;
          uVar5 = ~uVar5;
LAB_0025cad2:
          bVar1 = isWellFormedIPv4Address(addr + lVar4,end + uVar5);
          return bVar1;
        }
      }
    }
  }
  return false;
}

Assistant:

bool XMLUri::isWellFormedIPv6Reference(const XMLCh* const addr, const XMLSize_t length)
{
    XMLSize_t end = length-1;

    // Check if string is a potential match for IPv6reference.
    if (!(length > 2 && addr[0] == chOpenSquare && addr[end] == chCloseSquare))
    {
        return false;
    }

    // Counter for the number of 16-bit sections read in the address.
    int counter = 0;

    // Scan hex sequence before possible '::' or IPv4 address.
    int iIndex = scanHexSequence(addr, 1, end, counter);
    if (iIndex == -1)
        return false;

    XMLSize_t index=(XMLSize_t)iIndex;
    // Address must contain 128-bits of information.
    if (index == end)
    {
       return (counter == 8);
    }

    if (index+1 < end && addr[index] == chColon)
    {
        if (addr[index+1] == chColon)
        {
            // '::' represents at least one 16-bit group of zeros.
            if (++counter > 8)
            {
                return false;
            }
            index += 2;
            // Trailing zeros will fill out the rest of the address.
            if (index == end)
            {
                return true;
            }
        }
        // If the second character wasn't ':', in order to be valid,
        // the remainder of the string must match IPv4Address,
        // and we must have read exactly 6 16-bit groups.
        else
        {
            if (counter == 6)
                return isWellFormedIPv4Address(addr+index+1, end-index-1);
            else
                return false;
        }
    }
    else
    {
       return false;
    }

    // 3. Scan hex sequence after '::'.
    int prevCount = counter;
    iIndex = scanHexSequence(addr, index, end, counter);
    if (iIndex == -1)
        return false;

    index=(XMLSize_t)iIndex;
    // If this is the end of the address then
    // we've got 128-bits of information.
    if (index == end)
    {
        return true;
    }

    // The address ends in an IPv4 address, or it is invalid.
    // scanHexSequence has already made sure that we have the right number of bits.
    XMLSize_t shiftCount = (counter > prevCount) ? index+1 : index;
    return isWellFormedIPv4Address(addr + shiftCount, end - shiftCount);
}